

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

size_t plain_method(char *method,size_t method_len)

{
  int iVar1;
  size_t sVar2;
  char *new_method_1;
  char *new_method;
  size_t method_len_local;
  char *method_local;
  
  iVar1 = strncmp("ssh-rsa-cert-v01@openssh.com",method,method_len);
  if (iVar1 == 0) {
    method_local = (char *)0x7;
  }
  else {
    iVar1 = strncmp("rsa-sha2-256-cert-v01@openssh.com",method,method_len);
    if ((iVar1 == 0) ||
       (iVar1 = strncmp("rsa-sha2-512-cert-v01@openssh.com",method,method_len), iVar1 == 0)) {
      method_local = (char *)0xc;
    }
    else {
      iVar1 = strncmp("ecdsa-sha2-nistp256-cert-v01@openssh.com",method,method_len);
      if ((iVar1 == 0) ||
         ((iVar1 = strncmp("ecdsa-sha2-nistp384-cert-v01@openssh.com",method,method_len), iVar1 == 0
          || (iVar1 = strncmp("ecdsa-sha2-nistp521-cert-v01@openssh.com",method,method_len),
             iVar1 == 0)))) {
        method_local = (char *)0x13;
      }
      else {
        iVar1 = strncmp("ssh-ed25519-cert-v01@openssh.com",method,method_len);
        if (iVar1 == 0) {
          method_local = (char *)0xb;
        }
        else {
          iVar1 = strncmp("sk-ecdsa-sha2-nistp256-cert-v01@openssh.com",method,method_len);
          if (iVar1 == 0) {
            sVar2 = strlen("sk-ecdsa-sha2-nistp256@openssh.com");
            memcpy(method,"sk-ecdsa-sha2-nistp256@openssh.com",sVar2);
            method_local = (char *)strlen("sk-ecdsa-sha2-nistp256@openssh.com");
          }
          else {
            iVar1 = strncmp("sk-ssh-ed25519-cert-v01@openssh.com",method,method_len);
            method_local = (char *)method_len;
            if (iVar1 == 0) {
              sVar2 = strlen("sk-ssh-ed25519@openssh.com");
              memcpy(method,"sk-ssh-ed25519@openssh.com",sVar2);
              method_local = (char *)strlen("sk-ssh-ed25519@openssh.com");
            }
          }
        }
      }
    }
  }
  return (size_t)method_local;
}

Assistant:

size_t plain_method(char *method, size_t method_len)
{
    if(!strncmp("ssh-rsa-cert-v01@openssh.com",
                method,
                method_len)) {
        return 7;
    }

    if(!strncmp("rsa-sha2-256-cert-v01@openssh.com",
                method,
                method_len) ||
       !strncmp("rsa-sha2-512-cert-v01@openssh.com",
                method,
                method_len)) {
       return 12;
    }

    if(!strncmp("ecdsa-sha2-nistp256-cert-v01@openssh.com",
                method,
                method_len) ||
       !strncmp("ecdsa-sha2-nistp384-cert-v01@openssh.com",
                method,
                method_len) ||
       !strncmp("ecdsa-sha2-nistp521-cert-v01@openssh.com",
                method,
                method_len)) {
        return 19;
    }

    if(!strncmp("ssh-ed25519-cert-v01@openssh.com",
                method,
                method_len)) {
        return 11;
    }

    if(!strncmp("sk-ecdsa-sha2-nistp256-cert-v01@openssh.com",
                method,
                method_len)) {
        const char *new_method = "sk-ecdsa-sha2-nistp256@openssh.com";
        memcpy(method, new_method, strlen(new_method));
        return strlen(new_method);
    }

    if(!strncmp("sk-ssh-ed25519-cert-v01@openssh.com",
                method,
                method_len)) {
        const char *new_method = "sk-ssh-ed25519@openssh.com";
        memcpy(method, new_method, strlen(new_method));
        return strlen(new_method);
    }

    return method_len;
}